

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O3

void __thiscall
t_lua_generator::generate_lua_struct_definition
          (t_lua_generator *this,ostream *out,t_struct *tstruct,bool is_exception)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined7 in_register_00000009;
  long lVar3;
  char *pcVar4;
  pointer pptVar5;
  string local_50;
  
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,*(char **)CONCAT44(extraout_var,iVar1),
             ((undefined8 *)CONCAT44(extraout_var,iVar1))[1]);
  if ((int)CONCAT71(in_register_00000009,is_exception) == 0) {
    pcVar4 = " = __TObject:new{";
    lVar3 = 0x11;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(out," = TException:new{",0x12);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  __type = \'",0xc);
    iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,*(char **)CONCAT44(extraout_var_00,iVar1),
                        ((undefined8 *)CONCAT44(extraout_var_00,iVar1))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_start) goto LAB_002abb5e;
    pcVar4 = ",";
    lVar3 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar4,lVar3);
LAB_002abb5e:
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  iVar1 = (this->super_t_oop_generator).super_t_generator.indent_;
  (this->super_t_oop_generator).super_t_generator.indent_ = iVar1 + 1;
  pptVar5 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar5 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>
                (out,((*pptVar5)->name_)._M_dataplus._M_p,((*pptVar5)->name_)._M_string_length);
      pptVar5 = pptVar5 + 1;
      if (pptVar5 ==
          (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish) break;
      std::__ostream_insert<char,std::char_traits<char>>(out,",",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    } while (pptVar5 !=
             (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
    iVar1 = (this->super_t_oop_generator).super_t_generator.indent_ + -1;
  }
  (this->super_t_oop_generator).super_t_generator.indent_ = iVar1;
  t_generator::indent((t_generator *)this,out);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}",1);
  generate_lua_struct_reader(this,out,tstruct);
  generate_lua_struct_writer(this,out,tstruct);
  return;
}

Assistant:

void t_lua_generator::generate_lua_struct_definition(ostream& out,
                                                     t_struct* tstruct,
                                                     bool is_exception) {
  vector<t_field*>::const_iterator m_iter;
  const vector<t_field*>& members = tstruct->get_members();

  indent(out) << endl << endl << tstruct->get_name();
  if (is_exception) {
    out << " = TException:new{" << endl << indent() << "  __type = '" << tstruct->get_name() << "'";
    if (members.size() > 0) {
      out << ",";
    }
    out << endl;
  } else {
    out << " = __TObject:new{" << endl;
  }
  indent_up();
  for (m_iter = members.begin(); m_iter != members.end();) {
    indent(out);
    out << (*m_iter)->get_name();
    ++m_iter;
    if (m_iter != members.end()) {
      out << "," << endl;
    }
  }
  indent_down();
  indent(out);
  out << endl << "}";

  generate_lua_struct_reader(out, tstruct);
  generate_lua_struct_writer(out, tstruct);
}